

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

size_t lodepng_get_raw_size(uint w,uint h,LodePNGColorMode *color)

{
  uint uVar1;
  
  uVar1 = lodepng_get_bpp(color);
  return ((ulong)(w * h & 7) * (ulong)uVar1 + 7 >> 3) + (ulong)(w * h >> 3) * (ulong)uVar1;
}

Assistant:

size_t lodepng_get_raw_size(unsigned w, unsigned h, const LodePNGColorMode* color)
{
	/*will not overflow for any color type if roughly w * h < 268435455*/
	size_t bpp = lodepng_get_bpp(color);
	size_t n = w * h;
	return ((n / 8) * bpp) + ((n & 7) * bpp + 7) / 8;
}